

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void * lj_mem_realloc(lua_State *L,void *p,MSize osz,MSize nsz)

{
  ulong uVar1;
  void *pvVar2;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  global_State *g;
  
  uVar1 = (ulong)*(uint *)(in_RDI + 8);
  pvVar2 = (void *)(**(code **)(uVar1 + 0x10))(*(undefined8 *)(uVar1 + 0x18),in_RSI,in_EDX,in_ECX);
  if ((pvVar2 == (void *)0x0) && (in_ECX != 0)) {
    lj_err_mem((lua_State *)CONCAT44(in_EDX,in_ECX));
  }
  *(int *)(uVar1 + 0x20) = (*(int *)(uVar1 + 0x20) - in_EDX) + in_ECX;
  return pvVar2;
}

Assistant:

void *lj_mem_realloc(lua_State *L, void *p, MSize osz, MSize nsz)
{
  global_State *g = G(L);
  lua_assert((osz == 0) == (p == NULL));
  p = g->allocf(g->allocd, p, osz, nsz);
  if (p == NULL && nsz > 0)
    lj_err_mem(L);
  lua_assert((nsz == 0) == (p == NULL));
  lua_assert(checkptr32(p));
  g->gc.total = (g->gc.total - osz) + nsz;
  return p;
}